

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O3

filtration_entry_t __thiscall
priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
::pop_pivot(priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
            *this)

{
  unordered_map<long,_bool,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_bool>_>_>
  *puVar1;
  pointer pfVar2;
  _Node_iterator_base<std::pair<const_long,_bool>,_false> __it;
  iterator iVar3;
  long lVar4;
  filtration_entry_t fVar5;
  float local_2c;
  long local_28;
  
  if (this->use_dense_version == true) {
    puVar1 = &this->coefficients;
    local_28 = *(long *)((long)&((this->
                                 super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                                 ).c.
                                 super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->super_pair<float,_long>
                        + 8);
    __it._M_cur = (__node_type *)
                  std::
                  _Hashtable<long,_std::pair<const_long,_bool>,_std::allocator<std::pair<const_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&puVar1->_M_h,&local_28);
    if (__it._M_cur != (__node_type *)0x0) {
      do {
        if (((__it._M_cur)->super__Hash_node_value<std::pair<const_long,_bool>,_false>).
            super__Hash_node_value_base<std::pair<const_long,_bool>_>._M_storage._M_storage.__data
            [8] != '\0') break;
        std::
        _Hashtable<long,_std::pair<const_long,_bool>,_std::allocator<std::pair<const_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(&puVar1->_M_h,(const_iterator)__it._M_cur);
        std::
        priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
        ::pop(&this->
               super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             );
        local_28 = *(long *)((long)&((this->
                                     super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                                     ).c.
                                     super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                    super_pair<float,_long> + 8);
        __it._M_cur = (__node_type *)
                      std::
                      _Hashtable<long,_std::pair<const_long,_bool>,_std::allocator<std::pair<const_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(&puVar1->_M_h,&local_28);
      } while (__it._M_cur != (__node_type *)0x0);
    }
  }
  pfVar2 = (this->
           super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
           ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar2 == (this->
                super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
LAB_00120588:
    local_2c = 0.0;
    lVar4 = -1;
  }
  else {
    local_2c = (pfVar2->super_pair<float,_long>).first;
    lVar4 = (pfVar2->super_pair<float,_long>).second;
    if (this->use_dense_version == true) {
      local_28 = lVar4;
      iVar3 = std::
              _Hashtable<long,_std::pair<const_long,_bool>,_std::allocator<std::pair<const_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->coefficients)._M_h,&local_28);
      if (iVar3.super__Node_iterator_base<std::pair<const_long,_bool>,_false>._M_cur !=
          (__node_type *)0x0) {
        std::
        _Hashtable<long,_std::pair<const_long,_bool>,_std::allocator<std::pair<const_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(&(this->coefficients)._M_h,
                (const_iterator)
                iVar3.super__Node_iterator_base<std::pair<const_long,_bool>,_false>._M_cur);
      }
    }
    std::
    priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
    ::pop(&this->
           super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
         );
    pfVar2 = (this->
             super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((pfVar2 != (this->
                   super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                   ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish) &&
       ((pfVar2->super_pair<float,_long>).second == lVar4)) {
      puVar1 = &this->coefficients;
      do {
        if ((this->use_dense_version == true) &&
           (local_28 = lVar4,
           iVar3 = std::
                   _Hashtable<long,_std::pair<const_long,_bool>,_std::allocator<std::pair<const_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&puVar1->_M_h,&local_28),
           iVar3.super__Node_iterator_base<std::pair<const_long,_bool>,_false>._M_cur !=
           (__node_type *)0x0)) {
          std::
          _Hashtable<long,_std::pair<const_long,_bool>,_std::allocator<std::pair<const_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::erase(&puVar1->_M_h,
                  (const_iterator)
                  iVar3.super__Node_iterator_base<std::pair<const_long,_bool>,_false>._M_cur);
        }
        std::
        priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
        ::pop(&this->
               super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             );
        if (this->use_dense_version == true) {
          while( true ) {
            local_28 = *(long *)((long)&((this->
                                         super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                                         ).c.
                                         super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                        super_pair<float,_long> + 8);
            iVar3 = std::
                    _Hashtable<long,_std::pair<const_long,_bool>,_std::allocator<std::pair<const_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&puVar1->_M_h,&local_28);
            if ((iVar3.super__Node_iterator_base<std::pair<const_long,_bool>,_false>._M_cur ==
                 (__node_type *)0x0) ||
               (*(char *)((long)iVar3.super__Node_iterator_base<std::pair<const_long,_bool>,_false>.
                                _M_cur + 0x10) != '\0')) break;
            std::
            _Hashtable<long,_std::pair<const_long,_bool>,_std::allocator<std::pair<const_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::erase(&puVar1->_M_h,
                    (const_iterator)
                    iVar3.super__Node_iterator_base<std::pair<const_long,_bool>,_false>._M_cur);
            std::
            priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
            ::pop(&this->
                   super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                 );
          }
        }
        pfVar2 = (this->
                 super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                 ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (pfVar2 == (this->
                      super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                      ).c.
                      super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish) goto LAB_00120588;
        local_2c = (pfVar2->super_pair<float,_long>).first;
        lVar4 = (pfVar2->super_pair<float,_long>).second;
        if ((this->use_dense_version == true) &&
           (local_28 = lVar4,
           iVar3 = std::
                   _Hashtable<long,_std::pair<const_long,_bool>,_std::allocator<std::pair<const_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&puVar1->_M_h,&local_28),
           iVar3.super__Node_iterator_base<std::pair<const_long,_bool>,_false>._M_cur !=
           (__node_type *)0x0)) {
          std::
          _Hashtable<long,_std::pair<const_long,_bool>,_std::allocator<std::pair<const_long,_bool>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::erase(&puVar1->_M_h,
                  (const_iterator)
                  iVar3.super__Node_iterator_base<std::pair<const_long,_bool>,_false>._M_cur);
        }
        std::
        priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
        ::pop(&this->
               super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             );
        pfVar2 = (this->
                 super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                 ).c.super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      } while ((pfVar2 != (this->
                          super_priority_queue<filtration_entry_t,_std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                          ).c.
                          super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish) &&
              ((pfVar2->super_pair<float,_long>).second == lVar4));
    }
  }
  fVar5.super_pair<float,_long>._4_4_ = 0;
  fVar5.super_pair<float,_long>.first = local_2c;
  fVar5.super_pair<float,_long>.second = lVar4;
  return (filtration_entry_t)fVar5.super_pair<float,_long>;
}

Assistant:

filtration_entry_t pop_pivot() {
		remove_trivial_coefficient_entries();
		if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
			return filtration_entry_t(-1);
		else {
			auto pivot = get_top();
			safe_pop();
			while (!std::priority_queue<filtration_entry_t, Container, Comparator>::empty() &&
			       get_index(std::priority_queue<filtration_entry_t, Container, Comparator>::top()) ==
			           get_index(pivot)) {
				safe_pop();
				remove_trivial_coefficient_entries();

				if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
					return filtration_entry_t(-1);
				else {
					pivot = get_top();
					safe_pop();
				}
			}
			return pivot;
		}
	}